

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O1

void Amap_ManMatchNode(Amap_Man_t *p,Amap_Obj_t *pNode,int fFlow,int fRefs)

{
  size_t __n;
  ushort uVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  void **ppvVar4;
  int iVar5;
  uint uVar6;
  Amap_Cut_t **ppAVar7;
  Amap_Cut_t *pAVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  Amap_Cut_t *pAVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  Amap_Set_t *pAVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  Amap_Mat_t MD;
  Amap_Mat_t MA;
  Amap_Mat_t local_a8;
  int local_7c;
  Amap_Cut_t *local_78;
  Amap_Set_t *pAStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Amap_Cut_t *local_58;
  Amap_Set_t *pAStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = (Amap_Cut_t *)0x0;
  pAStack_50 = (Amap_Set_t *)0x0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = (Amap_Cut_t *)0x0;
  pAStack_70 = (Amap_Set_t *)0x0;
  local_a8.Area = 0.0;
  local_a8.AveFan = 0.0;
  local_a8.Delay = 0.0;
  local_a8._28_4_ = 0;
  local_a8.pCut = (Amap_Cut_t *)0x0;
  local_a8.pSet = (Amap_Set_t *)0x0;
  if (fRefs == 0) {
    fVar19 = (float)pNode->nRefs;
  }
  else {
    fVar19 = (pNode->EstRefs + pNode->EstRefs + (float)(pNode->nFouts[1] + pNode->nFouts[0])) / 3.0;
  }
  pNode->EstRefs = fVar19;
  local_7c = fRefs;
  if ((fRefs != 0) &&
     (iVar5 = pNode->nFouts[1] + pNode->nFouts[0],
     iVar5 != 0 && SCARRY4(pNode->nFouts[1],pNode->nFouts[0]) == iVar5 < 0)) {
    Amap_CutAreaDeref(p,&pNode->Best);
  }
  iVar5 = 0;
  local_78 = (Amap_Cut_t *)0x0;
  local_58 = (Amap_Cut_t *)0x0;
  if (0 < (int)pNode->nCuts) {
    pAVar12 = (Amap_Cut_t *)(pNode->field_11).pData;
    do {
      if ((ulong)*(ushort *)pAVar12 != 0) {
        for (pAVar16 = p->pLib->pNodes[*(ushort *)pAVar12].pSets; pAVar16 != (Amap_Set_t *)0x0;
            pAVar16 = pAVar16->pNext) {
          local_a8.Area = 0.0;
          local_a8.AveFan = 0.0;
          local_a8.Delay = 0.0;
          local_a8._28_4_ = 0;
          uVar1 = *(ushort *)&pAVar16->field_0x8;
          pVVar2 = p->pLib->vGates;
          local_a8.pCut = pAVar12;
          local_a8.pSet = pAVar16;
          if (fFlow == 0) {
            if (pVVar2->nSize <= (int)(uint)uVar1) goto LAB_004415f7;
            uVar6 = *(uint *)((long)pVVar2->pArray[uVar1] + 0x38) >> 0x18;
            uVar9 = (uint)*pAVar12 >> 0x11;
            if (uVar6 != uVar9) {
              __assert_fail("pGate->nPins == pM->pCut->nFans",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                            ,0x1ec,
                            "void Amap_ManMatchGetExacts(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)")
              ;
            }
            local_a8.AveFan = 0.0;
            local_a8.Delay = 0.0;
            if (0x1ffff < (uint)*pAVar12) {
              uVar10 = 0;
              do {
                if ((pAVar16->Ins[uVar10] < '\0') ||
                   (uVar13 = *(uint *)((long)&pAVar12[1].field_0x0 +
                                      (ulong)((byte)pAVar16->Ins[uVar10] & 0xfffffffe) * 2),
                   (int)uVar13 < 0)) goto LAB_004415b8;
                uVar13 = uVar13 >> 1;
                if (p->vObjs->nSize <= (int)uVar13) goto LAB_004415f7;
                pvVar3 = p->vObjs->pArray[uVar13];
                iVar15 = (int)local_a8.Delay;
                if ((int)local_a8.Delay <= (int)*(float *)((long)pvVar3 + 0x58)) {
                  iVar15 = (int)*(float *)((long)pvVar3 + 0x58);
                }
                local_a8.Delay = (float)iVar15;
                local_a8.AveFan =
                     local_a8.AveFan +
                     (float)(*(int *)((long)pvVar3 + 0x38) + *(int *)((long)pvVar3 + 0x34));
                uVar10 = uVar10 + 1;
              } while (uVar9 != uVar10);
            }
            local_a8.AveFan = local_a8.AveFan / (float)uVar6;
            local_a8.Delay = local_a8.Delay + 1.0;
            pVVar2 = p->vTempP;
            pVVar2->nSize = 0;
            local_a8.Area = Amap_CutAreaRef2(p,&local_a8,pVVar2,8);
            pVVar2 = p->vTempP;
            if (0 < pVVar2->nSize) {
              ppvVar4 = pVVar2->pArray;
              lVar11 = 0;
              do {
                *(int *)ppvVar4[lVar11] = *ppvVar4[lVar11] + -1;
                lVar11 = lVar11 + 1;
              } while (lVar11 < pVVar2->nSize);
            }
            uVar6 = (*(uint *)&pAVar16->field_0x8 ^ (uint)*pAVar12) >> 0x10 & 1;
            if ((pNode->nFouts[uVar6] == 0) && (0 < pNode->nFouts[uVar6 ^ 1])) {
              local_a8.Area = local_a8.Area + p->fAreaInv;
            }
          }
          else {
            if (pVVar2->nSize <= (int)(uint)uVar1) {
LAB_004415f7:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            uVar6 = *(uint *)((long)pVVar2->pArray[uVar1] + 0x38) >> 0x18;
            uVar9 = (uint)*pAVar12 >> 0x11;
            if (uVar6 != uVar9) {
              __assert_fail("pGate->nPins == pM->pCut->nFans",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapMatch.c"
                            ,0x1c2,"void Amap_ManMatchGetFlows(Amap_Man_t *, Amap_Mat_t *)");
            }
            local_a8.Area = (float)*(double *)((long)pVVar2->pArray[uVar1] + 0x20);
            local_a8.AveFan = 0.0;
            local_a8.Delay = 0.0;
            if (0x1ffff < (uint)*pAVar12) {
              uVar10 = 0;
              do {
                if ((pAVar16->Ins[uVar10] < '\0') ||
                   (uVar13 = *(uint *)((long)&pAVar12[1].field_0x0 +
                                      (ulong)((byte)pAVar16->Ins[uVar10] & 0xfffffffe) * 2),
                   (int)uVar13 < 0)) {
LAB_004415b8:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar13 = uVar13 >> 1;
                if (p->vObjs->nSize <= (int)uVar13) goto LAB_004415f7;
                pvVar3 = p->vObjs->pArray[uVar13];
                iVar15 = (int)*(float *)((long)pvVar3 + 0x58);
                if ((int)*(float *)((long)pvVar3 + 0x58) < (int)local_a8.Delay) {
                  iVar15 = (int)local_a8.Delay;
                }
                fVar19 = *(float *)((long)pvVar3 + 0x50);
                iVar14 = *(int *)((long)pvVar3 + 0x38) + *(int *)((long)pvVar3 + 0x34);
                if (iVar14 != 0) {
                  fVar19 = fVar19 / *(float *)((long)pvVar3 + 0x30);
                }
                fVar17 = 1e+32;
                if (local_a8.Area < 1e+32 && fVar19 < 1e+32) {
                  fVar17 = fVar19 + local_a8.Area;
                }
                local_a8.Area = fVar17;
                local_a8.Delay = (float)iVar15;
                local_a8.AveFan = local_a8.AveFan + (float)iVar14;
                uVar10 = uVar10 + 1;
              } while (uVar9 != uVar10);
            }
            local_a8.AveFan = local_a8.AveFan / (float)uVar6;
            local_a8.Delay = local_a8.Delay + 1.0;
          }
          if (local_78 == (Amap_Cut_t *)0x0) {
LAB_004413ab:
            local_68 = CONCAT44(local_a8.AveFan,local_a8.Area);
            uStack_60 = CONCAT44(local_a8._28_4_,local_a8.Delay);
            local_78 = local_a8.pCut;
            pAStack_70 = local_a8.pSet;
          }
          else {
            fVar19 = p->pPars->fEpsilon;
            if ((local_a8.Delay - fVar19 <= (float)uStack_60) &&
               ((local_a8.Delay + fVar19 < (float)uStack_60 ||
                ((local_a8.Area - fVar19 <= (float)local_68 &&
                 ((local_a8.Area + fVar19 < (float)local_68 ||
                  (local_68._4_4_ <= local_a8.AveFan - fVar19)))))))) goto LAB_004413ab;
          }
          if (local_58 == (Amap_Cut_t *)0x0) {
LAB_004413ef:
            local_48 = CONCAT44(local_a8.AveFan,local_a8.Area);
            uStack_40 = CONCAT44(local_a8._28_4_,local_a8.Delay);
            local_58 = local_a8.pCut;
            pAStack_50 = local_a8.pSet;
          }
          else {
            fVar19 = p->pPars->fEpsilon;
            if ((local_a8.Area - fVar19 <= (float)local_48) &&
               ((local_a8.Area + fVar19 < (float)local_48 ||
                ((local_48._4_4_ <= local_a8.AveFan - fVar19 &&
                 ((local_48._4_4_ < local_a8.AveFan + fVar19 ||
                  (local_a8.Delay - fVar19 <= (float)uStack_40)))))))) goto LAB_004413ef;
          }
        }
      }
      iVar5 = iVar5 + 1;
      pAVar12 = pAVar12 + (ulong)((uint)*pAVar12 >> 0x11) + 1;
    } while (iVar5 < (int)pNode->nCuts);
  }
  fVar17 = (float)local_48 - (float)local_68;
  fVar19 = -fVar17;
  if (-fVar17 <= fVar17) {
    fVar19 = fVar17;
  }
  fVar18 = (float)uStack_40 - (float)uStack_60;
  fVar17 = -fVar18;
  if (-fVar18 <= fVar18) {
    fVar17 = fVar18;
  }
  ppAVar7 = &local_58;
  if (fVar19 / (float)local_68 < (fVar17 * p->pPars->fADratio) / (float)uStack_40) {
    ppAVar7 = &local_78;
  }
  *(ulong *)pNode =
       *(ulong *)pNode & 0x7fffffffffffffff |
       (ulong)(((uint)ppAVar7[1][2] ^ (uint)**ppAVar7) >> 0x10) << 0x3f;
  pAVar16 = (Amap_Set_t *)ppAVar7[1];
  pAVar12 = ppAVar7[2];
  pAVar8 = ppAVar7[3];
  (pNode->Best).pCut = *ppAVar7;
  (pNode->Best).pSet = pAVar16;
  *(Amap_Cut_t **)&(pNode->Best).Area = pAVar12;
  *(Amap_Cut_t **)&(pNode->Best).Delay = pAVar8;
  pAVar12 = (pNode->Best).pCut;
  __n = (ulong)((uint)*pAVar12 >> 0x11) * 4 + 4;
  pAVar8 = (Amap_Cut_t *)Aig_MmFlexEntryFetch(p->pMemCutBest,(int)__n);
  memcpy(pAVar8,pAVar12,__n);
  (pNode->Best).pCut = pAVar8;
  if ((local_7c != 0) &&
     (iVar5 = pNode->nFouts[1] + pNode->nFouts[0],
     iVar5 != 0 && SCARRY4(pNode->nFouts[1],pNode->nFouts[0]) == iVar5 < 0)) {
    Amap_CutAreaRef(p,&pNode->Best);
    return;
  }
  return;
}

Assistant:

void Amap_ManMatchNode( Amap_Man_t * p, Amap_Obj_t * pNode, int fFlow, int fRefs )
{
    int fVerbose = 0; //(pNode->Level == 2 || pNode->Level == 4);
    int fVeryVerbose = fVerbose;

    Amap_Mat_t MA = {0}, MD = {0}, M = {0};
    Amap_Mat_t * pMBestA = &MA, * pMBestD = &MD, * pMThis = &M, * pMBest;
    Amap_Cut_t * pCut;
    Amap_Set_t * pSet;
    Amap_Nod_t * pNod;
    int i;

    if ( fRefs )
        pNode->EstRefs = (float)((2.0 * pNode->EstRefs + Amap_ObjRefsTotal(pNode)) / 3.0);
    else
        pNode->EstRefs = (float)pNode->nRefs;
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaDeref( p, &pNode->Best );

    if ( fVerbose )
        printf( "\nNode %d (%d)\n", pNode->Id, pNode->Level );

    pMBestA->pCut = pMBestD->pCut = NULL;
    Amap_NodeForEachCut( pNode, pCut, i )
    {
        if ( pCut->iMat == 0 )
            continue;
        pNod = Amap_LibNod( p->pLib, pCut->iMat );
        Amap_LibNodeForEachSet( pNod, pSet )
        {
            Amap_ManMatchStart( pMThis, pCut, pSet );
            if ( fFlow )
                Amap_ManMatchGetFlows( p, pMThis );
            else
                Amap_ManMatchGetExacts( p, pNode, pMThis );
            if ( pMBestD->pCut == NULL || Amap_CutCompareDelay(p, pMBestD, pMThis) == 1 )
                *pMBestD = *pMThis;
            if ( pMBestA->pCut == NULL || Amap_CutCompareArea(p, pMBestA, pMThis) == 1 )
                *pMBestA = *pMThis;

            if ( fVeryVerbose ) 
            {
                printf( "Cut %2d (%d) :  ", i, pCut->nFans );
                printf( "Gate %10s  ",      Amap_LibGate(p->pLib, pMThis->pSet->iGate)->pName );
                printf( "%s  ",             pMThis->pSet->fInv ? "inv" : "   " );
                printf( "Delay %5.2f  ",    pMThis->Delay );
                printf( "Area %5.2f  ",     pMThis->Area );
                printf( "\n" );
            }
        }
    }

    if ( Abc_AbsFloat(pMBestA->Area - pMBestD->Area) / pMBestD->Area >= p->pPars->fADratio * Abc_AbsFloat(pMBestA->Delay - pMBestD->Delay) / pMBestA->Delay )
        pMBest = pMBestA;
    else
        pMBest = pMBestD;

    if ( fVerbose )
    {
        printf( "BEST MATCHA:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestA->pSet->iGate)->pName );
        printf( "%s  ",           pMBestA->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestA->Delay );
        printf( "Area %5.2f  ",   pMBestA->Area );
        printf( "\n" ); 

        printf( "BEST MATCHD:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestD->pSet->iGate)->pName );
        printf( "%s  ",           pMBestD->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestD->Delay );
        printf( "Area %5.2f  ",   pMBestD->Area );
        printf( "\n" ); 

        printf( "BEST MATCH :  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBest->pSet->iGate)->pName );
        printf( "%s  ",           pMBest->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBest->Delay );
        printf( "Area %5.2f  ",   pMBest->Area );
        printf( "\n" ); 
    }

    pNode->fPolar = pMBest->pCut->fInv ^ pMBest->pSet->fInv;
    pNode->Best = *pMBest;
    pNode->Best.pCut = Amap_ManDupCut( p, pNode->Best.pCut );
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaRef( p, &pNode->Best );
}